

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalid_Classifier_OnlyTarget(void)

{
  void *pvVar1;
  string *psVar2;
  pointer pcVar3;
  Rep *pRVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  LogMessage *other;
  CategoricalCrossEntropyLossLayer *pCVar8;
  FeatureType *this;
  ArrayFeatureType *this_00;
  ostream *poVar9;
  long lVar10;
  int iVar11;
  long *plVar12;
  void **ppvVar13;
  NetworkUpdateParameters *pNVar14;
  long lVar15;
  Model spec;
  string target;
  FeatureDescription feature;
  Result res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  TensorAttributes tensorAttributesIn;
  string labels [4];
  LogFinisher local_1c9;
  Model local_1c8;
  string local_198;
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  _func_int **local_140;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<long,_std::allocator<long>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  TensorAttributes local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  CoreML::Specification::Model::Model(&local_1c8);
  CoreML::Result::Result((Result *)&local_140);
  local_c8.name._0_4_ = 0x2f3795;
  local_c8.name._4_4_ = 0;
  local_c8.dimension = 3;
  local_c8._12_4_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"2","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"3","");
  plVar12 = local_48;
  local_58[0] = plVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
             &local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 2),
             (allocator_type *)local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,&local_e0);
  local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel(&local_1c8,true,&local_c8,&local_f8,&local_118,true);
  if (local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  local_1c8.specificationversion_ = 4;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1c8.description_ = pMVar6;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1c8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  if (local_1c8._oneof_case_[0] != 0x193) {
    local_1c8.Type_.neuralnetworkclassifier_ =
         CoreML::Specification::NeuralNetworkClassifier::default_instance();
  }
  pNVar14 = (local_1c8.Type_.neuralnetworkclassifier_)->updateparams_;
  if (pNVar14 == (NetworkUpdateParameters *)0x0) {
    pNVar14 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if ((pNVar14->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_178,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_178,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_1c9,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_178);
  }
  pvVar1 = ((pNVar14->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if (*(int *)((long)pvVar1 + 0x24) == 10) {
    pCVar8 = *(CategoricalCrossEntropyLossLayer **)((long)pvVar1 + 0x18);
  }
  else {
    pCVar8 = CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
  }
  psVar2 = (pCVar8->target_).ptr_;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar3 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar3,pcVar3 + psVar2->_M_string_length);
  psVar2 = (pTVar7->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_198);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  this = pTVar7->type_;
  if (this == (FeatureType *)0x0) {
    this = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(this);
    pTVar7->type_ = this;
  }
  if (this->_oneof_case_[0] == 5) {
    this_00 = (this->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this);
    this->_oneof_case_[0] = 5;
    this_00 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_00);
    (this->Type_).multiarraytype_ = this_00;
  }
  this_00->datatype_ = 0x20020;
  iVar11 = (this_00->shape_).current_size_;
  if (iVar11 == (this_00->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_00->shape_,iVar11 + 1);
    iVar11 = (this_00->shape_).current_size_;
  }
  (this_00->shape_).current_size_ = iVar11 + 1;
  ((this_00->shape_).rep_)->elements[iVar11] = 1;
  CoreML::Model::validate((Result *)local_178,&local_1c8);
  local_140 = (_func_int **)local_178;
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != local_160) {
    operator_delete(local_170._M_p,(ulong)(local_160[0]._M_allocated_capacity + 1));
  }
  bVar5 = CoreML::Result::good((Result *)&local_140);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x8b1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    pMVar6 = local_1c8.description_;
    if (local_1c8.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar4 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar13 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar13 = (void **)0x0;
    }
    lVar15 = (long)(pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar15 != 0) {
      lVar10 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_178,*(FeatureDescription **)((long)ppvVar13 + lVar10)
                  );
        if (local_1c8.description_ == (ModelDescription *)0x0) {
          pMVar6 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
          local_1c8.description_ = pMVar6;
        }
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                            (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar7,(FeatureDescription *)local_178);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_178);
        lVar10 = lVar10 + 8;
      } while (lVar15 * 8 != lVar10);
    }
    CoreML::Model::validate((Result *)local_178,&local_1c8);
    local_140 = (_func_int **)local_178;
    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != local_160) {
      operator_delete(local_170._M_p,(ulong)(local_160[0]._M_allocated_capacity + 1));
    }
    bVar5 = CoreML::Result::good((Result *)&local_140);
    iVar11 = 0;
    if (bVar5) goto LAB_001aabe6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x8b9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  iVar11 = 1;
  std::ostream::flush();
LAB_001aabe6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  lVar15 = -0x80;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != &local_128) {
    operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1c8);
  return iVar11;
}

Assistant:

int testInvalid_Classifier_OnlyTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add model's inputs to training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}